

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O3

TValue * luaH_setnum(lua_State *L,Table *t,int key)

{
  TValue *pTVar1;
  TValue *i_o;
  TValue k;
  Value local_28;
  undefined4 local_20;
  
  pTVar1 = luaH_getnum(t,key);
  if (pTVar1 == &luaO_nilobject_) {
    local_28.n = (lua_Number)key;
    local_20 = 3;
    pTVar1 = newkey(L,t,(TValue *)&local_28);
  }
  return pTVar1;
}

Assistant:

TValue *luaH_setnum (lua_State *L, Table *t, int key) {
  const TValue *p = luaH_getnum(t, key);
  if (p != luaO_nilobject)
    return cast(TValue *, p);
  else {
    TValue k;
    setnvalue(&k, cast_num(key));
    return newkey(L, t, &k);
  }
}